

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleArrayHandling.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  Slice slice;
  ostream *poVar1;
  Builder *sub;
  size_t i;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Slice f;
  _Any_data local_1e8;
  code *local_1d8;
  code *pcStack_1d0;
  uint8_t *local_1c0;
  ArrayIterator __begin1;
  Builder filtered;
  Builder b;
  
  arangodb::velocypack::Builder::Builder(&b);
  arangodb::velocypack::Value::Value((Value *)&filtered,Array,false);
  sub = &filtered;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&b,(Value *)sub);
  for (p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa;
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var2->_vptr__Sp_counted_base + 1)) {
    filtered._buffer.
    super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr._0_1_ = 0xc;
    filtered._buffer.
    super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr._4_4_ = 4;
    sub = &filtered;
    filtered._buffer.
    super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&b,(Value *)&filtered);
  }
  arangodb::velocypack::Builder::close(&b,(int)sub);
  slice._start = arangodb::velocypack::Builder::start(&b);
  local_1e8._M_unused._M_object = (uint8_t *)0x0;
  local_1e8._8_8_ = (uint8_t *)0x0;
  pcStack_1d0 = std::
                _Function_handler<bool_(const_arangodb::velocypack::Slice_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arangodb[P]velocypack/examples/exampleArrayHandling.cpp:24:29)>
                ::_M_invoke;
  local_1d8 = std::
              _Function_handler<bool_(const_arangodb::velocypack::Slice_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arangodb[P]velocypack/examples/exampleArrayHandling.cpp:24:29)>
              ::_M_manager;
  arangodb::velocypack::Collection::filter(&filtered,slice,(Predicate *)&local_1e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1e8);
  f = arangodb::velocypack::Builder::slice(&filtered);
  poVar1 = std::operator<<((ostream *)&std::cout,"Filtered length: ");
  arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::length
            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&f);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Iterating Array members:");
  std::endl<char,std::char_traits<char>>(poVar1);
  arangodb::velocypack::ArrayIterator::ArrayIterator((ArrayIterator *)&local_1e8,f);
  __begin1._size = (ValueLength)local_1d8;
  __begin1._position = (ValueLength)pcStack_1d0;
  __begin1._slice._start = (uint8_t *)local_1e8._M_unused._0_8_;
  __begin1._current = (uint8_t *)local_1e8._8_8_;
  while (__begin1._position != __begin1._size) {
    local_1c0 = (uint8_t *)arangodb::velocypack::ArrayIterator::value(&__begin1);
    poVar1 = arangodb::velocypack::operator<<((ostream *)&std::cout,(Slice *)&local_1c0);
    poVar1 = std::operator<<(poVar1,", number value: ");
    arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
    getUInt((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&local_1c0);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    arangodb::velocypack::ArrayIterator::next(&__begin1);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Iterating some Array members using forEach:");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_1e8._M_unused._M_object = (void *)0x0;
  local_1e8._8_8_ = 0;
  pcStack_1d0 = std::
                _Function_handler<bool_(const_arangodb::velocypack::Slice_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arangodb[P]velocypack/examples/exampleArrayHandling.cpp:45:26)>
                ::_M_invoke;
  local_1d8 = std::
              _Function_handler<bool_(const_arangodb::velocypack::Slice_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arangodb[P]velocypack/examples/exampleArrayHandling.cpp:45:26)>
              ::_M_manager;
  arangodb::velocypack::Collection::forEach(f,(Predicate *)&local_1e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1e8);
  arangodb::velocypack::Builder::~Builder(&filtered);
  arangodb::velocypack::Builder::~Builder(&b);
  return 0;
}

Assistant:

int main(int, char*[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  // create an array with 10 number members
  Builder b;

  b(Value(ValueType::Array));
  for (size_t i = 0; i < 10; ++i) {
    b.add(Value(i));
  }
  b.close();

  // a Slice is a lightweight accessor for a VPack value
  Slice s(b.start());

  // filter out all array values less than 5
  Builder filtered =
      Collection::filter(s, [](Slice const& current, ValueLength) {
        if (current.getNumber<int>() < 5) {
          // exclude
          return false;
        }
        // include
        return true;
      });

  // print filtered array
  Slice f(filtered.slice());
  std::cout << "Filtered length: " << f.length() << std::endl;

  // now iterate over the (left over) array members
  std::cout << "Iterating Array members:" << std::endl;
  for (auto const& it : ArrayIterator(f)) {
    std::cout << it << ", number value: " << it.getUInt() << std::endl;
  }

  // iterate again, this time using Collection::forEach
  std::cout << "Iterating some Array members using forEach:" << std::endl;
  Collection::forEach(f, [](Slice const& current, ValueLength index) {
    std::cout << current << ", number value: " << current.getUInt()
              << std::endl;
    return (index != 2);  // stop after the 3rd element (indexes are 0-based)
  });

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}